

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ArrayIndex index;
  Value *pVVar1;
  Value local_40;
  Value *local_18;
  Value *value_local;
  Value *this_local;
  
  local_18 = value;
  value_local = this;
  Value(&local_40,value);
  index = size(this);
  pVVar1 = operator[](this,index);
  pVVar1 = operator=(pVVar1,&local_40);
  ~Value(&local_40);
  return pVVar1;
}

Assistant:

Value& Value::append(Value&& value) { return (*this)[size()] = value; }